

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_torrent.cpp
# Opt level: O0

void libtorrent::anon_unknown_25::update_atp
               (shared_ptr<libtorrent::torrent_info> *ti,add_torrent_params *atp)

{
  sha256_hash pad_00;
  bool bVar1;
  int iVar2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> index;
  int iVar3;
  element_type *peVar4;
  pointer *this;
  reference __x;
  file_storage *pfVar5;
  pointer ppVar6;
  int64_t iVar7;
  vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *pvVar8;
  index_type iVar9;
  difference_type dVar10;
  long lVar11;
  value_type *this_00;
  string *psVar12;
  time_t tVar13;
  info_hash_t *__src;
  span<const_char> sVar14;
  int local_200;
  int end;
  int i_1;
  value_type *mask;
  sha256_hash local_1e8;
  file_storage *local_1c8;
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  span<const_libtorrent::digest32<256L>_> local_1a8;
  undefined1 local_194 [8];
  sha256_hash computed_root;
  int piece_layer_size;
  int num_pieces;
  char *pcStack_160;
  int full_size;
  int local_158;
  int local_154;
  int i;
  value_type *layer;
  undefined1 local_140 [8];
  span<const_char> bytes;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> f;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_114
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin3;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range3;
  file_storage *fs;
  sha256_hash pad;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> scratch;
  int blocks_per_piece;
  web_seed_entry *ws;
  iterator __end2_1;
  iterator __begin2_1;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *__range2_1;
  uint local_90 [4];
  reference local_80;
  announce_entry *ae;
  iterator __end2;
  iterator __begin2;
  vector<lt::announce_entry> *__range2;
  internal_drained_state drained_state;
  add_torrent_params *atp_local;
  shared_ptr<libtorrent::torrent_info> *ti_local;
  
  drained_state.nodes.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)atp;
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  torrent_info::_internal_drain((internal_drained_state *)&__range2,peVar4);
  __end2 = ::std::
           vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ::begin((vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                    *)&__range2);
  ae = (announce_entry *)
       ::std::
       vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
       end((vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
                                     *)&ae), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
               ::operator*(&__end2);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&((drained_state.nodes.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_2 + 8
                   ),&local_80->url);
    local_90[0] = (uint)local_80->tier;
    ::std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &drained_state.nodes.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[1].first._M_string_length,
               (value_type_conflict2 *)local_90);
    __gnu_cxx::
    __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
    ::operator++(&__end2);
  }
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  bVar1 = torrent_info::is_i2p(peVar4);
  if (bVar1) {
    libtorrent::flags::bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>::operator|=
              ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void> *)
               ((long)&drained_state.nodes.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[6].first.field_2 + 8),
               (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x1000000);
  }
  this = &drained_state.urls.
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2_1 = ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ::begin((vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                      *)this);
  ws = (web_seed_entry *)
       ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::end
                 ((vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *
                  )this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
                             *)&ws), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
          ::operator*(&__end2_1);
    if (__x->type == '\0') {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&drained_state.nodes.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[0xb].first.field_2,
                  &__x->url);
    }
    else if (__x->type == '\x01') {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&drained_state.nodes.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[10].second,&__x->url);
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
    ::operator++(&__end2_1);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&drained_state.nodes.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].second,
              (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&drained_state.web_seeds.
                  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  bVar1 = torrent_info::v2_piece_hashes_verified(peVar4);
  if (bVar1) {
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ti);
    pfVar5 = torrent_info::files(peVar4);
    iVar2 = file_storage::blocks_per_piece(pfVar5);
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::vector
              ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
               (pad.m_number._M_elems + 6));
    merkle_pad((sha256_hash *)&fs,iVar2,1);
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ti);
    pfVar5 = torrent_info::files(peVar4);
    ppVar6 = drained_state.nodes.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10;
    iVar2 = file_storage::num_files(pfVar5);
    libtorrent::aux::
    container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
    ::resize<int,void>((container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
                        *)ppVar6,iVar2);
    ppVar6 = drained_state.nodes.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10;
    iVar2 = file_storage::num_files(pfVar5);
    libtorrent::aux::
    container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
    ::resize<int,void>((container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
                        *)((ppVar6->first).field_2._M_local_buf + 8),iVar2);
    ___end3 = file_storage::file_range(pfVar5);
    local_114 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         *)&__end3);
    rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
          ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                 *)&__end3);
    while (bVar1 = libtorrent::operator!=(local_114,rhs), bVar1) {
      index = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
              ::operator*(&local_114);
      bVar1 = file_storage::pad_file_at(pfVar5,(file_index_t)index.m_val);
      if ((!bVar1) &&
         (bytes.m_len._4_4_ = index,
         iVar7 = file_storage::file_size(pfVar5,(file_index_t)index.m_val), iVar7 != 0)) {
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)ti);
        layer._4_4_ = index;
        sVar14 = torrent_info::piece_layer(peVar4,(file_index_t)index.m_val);
        bytes.m_ptr = (char *)sVar14.m_len;
        local_140 = (undefined1  [8])sVar14.m_ptr;
        local_154 = index.m_val;
        pvVar8 = (vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
                 libtorrent::aux::
                 container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                 ::operator[]((container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                               *)(drained_state.nodes.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x10),index);
        _i = pvVar8;
        iVar9 = span<const_char>::size((span<const_char> *)local_140);
        dVar10 = digest32<256L>::size();
        ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
        reserve((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
                pvVar8,iVar9 / dVar10);
        for (local_158 = 0; lVar11 = (long)local_158,
            iVar9 = span<const_char>::size((span<const_char> *)local_140), pvVar8 = _i,
            lVar11 < iVar9; local_158 = (int)dVar10 + local_158) {
          pcStack_160 = span<const_char>::data((span<const_char> *)local_140);
          pcStack_160 = pcStack_160 + local_158;
          ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
          emplace_back<char_const*>(pvVar8,&stack0xfffffffffffffea0);
          dVar10 = digest32<256L>::size();
        }
        iVar2 = file_storage::file_num_blocks(pfVar5,index.m_val);
        iVar2 = merkle_num_leafs(iVar2);
        iVar2 = merkle_num_nodes(iVar2);
        computed_root.m_number._M_elems[7] = (uint)index;
        iVar3 = file_storage::file_num_pieces(pfVar5,index.m_val);
        computed_root.m_number._M_elems[6] = merkle_num_leafs(iVar3);
        bVar1 = ::std::
                vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                empty((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       *)_i);
        if (!bVar1) {
          span<libtorrent::digest32<256l>const>::
          span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                    ((span<libtorrent::digest32<256l>const> *)&local_1a8,
                     (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      *)_i);
          local_1b8[0] = pad.m_number._M_elems[2];
          local_1b8[1] = pad.m_number._M_elems[3];
          auStack_1b0[0] = pad.m_number._M_elems[4];
          auStack_1b0[1] = pad.m_number._M_elems[5];
          local_1c8 = fs;
          auStack_1c0[0] = pad.m_number._M_elems[0];
          auStack_1c0[1] = pad.m_number._M_elems[1];
          pad_00.m_number._M_elems[2] = pad.m_number._M_elems[0];
          pad_00.m_number._M_elems[3] = pad.m_number._M_elems[1];
          pad_00.m_number._M_elems._0_8_ = fs;
          pad_00.m_number._M_elems[4] = pad.m_number._M_elems[2];
          pad_00.m_number._M_elems[5] = pad.m_number._M_elems[3];
          pad_00.m_number._M_elems[6] = pad.m_number._M_elems[4];
          pad_00.m_number._M_elems[7] = pad.m_number._M_elems[5];
          merkle_root_scratch((sha256_hash *)local_194,local_1a8,computed_root.m_number._M_elems[6],
                              pad_00,(vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      *)(pad.m_number._M_elems + 6));
          mask._4_4_ = index;
          file_storage::root(&local_1e8,pfVar5,(file_index_t)index.m_val);
          bVar1 = digest32<256L>::operator!=((digest32<256L> *)local_194,&local_1e8);
          if (bVar1) {
            mask._0_4_ = 0xd7;
            libtorrent::aux::
            throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                      ((error_code_enum *)&mask);
          }
        }
        this_00 = libtorrent::aux::
                  container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                  ::operator[]((container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                                *)((long)&drained_state.nodes.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage[0x10].
                                          first.field_2 + 8),index);
        bitfield::resize(this_00,iVar2,false);
        local_200 = merkle_first_leaf(computed_root.m_number._M_elems[6]);
        iVar3 = local_200 + iVar3;
        for (; local_200 < iVar3; local_200 = local_200 + 1) {
          bitfield::set_bit(this_00,local_200);
        }
      }
      index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
      operator++(&local_114);
    }
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ti);
    torrent_info::free_piece_layers(peVar4);
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::~vector
              ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
               (pad.m_number._M_elems + 6));
  }
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  psVar12 = torrent_info::comment_abi_cxx11_(peVar4);
  ::std::__cxx11::string::operator=
            ((string *)
             drained_state.nodes.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[0x13].first.field_2._M_local_buf,
             (string *)psVar12);
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  psVar12 = torrent_info::creator_abi_cxx11_(peVar4);
  ::std::__cxx11::string::operator=
            ((string *)
             &drained_state.nodes.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[0x14].first._M_string_length,
             (string *)psVar12);
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  tVar13 = torrent_info::creation_date(peVar4);
  *(time_t *)
   &drained_state.nodes.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].first = tVar13;
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ti);
  __src = torrent_info::info_hashes(peVar4);
  memcpy((void *)((long)&drained_state.nodes.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[7].first.
                         _M_string_length + 4),__src,0x34);
  ::std::shared_ptr<libtorrent::torrent_info>::operator=
            ((shared_ptr<libtorrent::torrent_info> *)
             &((drained_state.nodes.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_string_length,ti);
  libtorrent::aux::internal_drained_state::~internal_drained_state
            ((internal_drained_state *)&__range2);
  return;
}

Assistant:

void update_atp(std::shared_ptr<torrent_info> ti, add_torrent_params& atp)
	{
		// This is a temporary measure until all non info-dict content is parsed
		// here, rather than the torrent_info constructor
		auto drained_state = ti->_internal_drain();
		for (auto const& ae : drained_state.urls)
		{
			atp.trackers.push_back(std::move(ae.url));
			atp.tracker_tiers.push_back(ae.tier);
		}

		if (ti->is_i2p())
			atp.flags |= torrent_flags::i2p_torrent;

		for (auto const& ws : drained_state.web_seeds)
		{
#if TORRENT_ABI_VERSION < 4
			if (ws.type == web_seed_entry::url_seed)
#endif
				atp.url_seeds.push_back(std::move(ws.url));
#if TORRENT_ABI_VERSION < 4
			else if (ws.type == web_seed_entry::http_seed)
				atp.http_seeds.push_back(std::move(ws.url));
#endif
		}

		atp.dht_nodes = std::move(drained_state.nodes);

		if (ti->v2_piece_hashes_verified())
		{
			int const blocks_per_piece = ti->files().blocks_per_piece();
			std::vector<sha256_hash> scratch;
			sha256_hash const pad = merkle_pad(blocks_per_piece, 1);
			file_storage const& fs = ti->files();
			atp.merkle_trees.resize(fs.num_files());
			atp.merkle_tree_mask.resize(fs.num_files());
			for (auto const f : fs.file_range())
			{
				if (fs.pad_file_at(f)) continue;
				if (fs.file_size(f) == 0) continue;
				auto const bytes = ti->piece_layer(f);
				auto& layer = atp.merkle_trees[f];
				layer.reserve(std::size_t(bytes.size() / sha256_hash::size()));
				for (int i = 0; i < bytes.size(); i += int(sha256_hash::size()))
					layer.emplace_back(bytes.data() + i);

				int const full_size = merkle_num_nodes(
					merkle_num_leafs(fs.file_num_blocks(f)));
				int const num_pieces = fs.file_num_pieces(f);
				int const piece_layer_size = merkle_num_leafs(num_pieces);

				if (!layer.empty())
				{
					sha256_hash const computed_root = merkle_root_scratch(layer
						, piece_layer_size
						, pad
						, scratch);
					if (computed_root != fs.root(f))
						aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);
				}

				auto& mask = atp.merkle_tree_mask[f];
				mask.resize(full_size, false);
				for (int i = merkle_first_leaf(piece_layer_size)
					, end = i + num_pieces; i < end; ++i)
				{
					mask.set_bit(i);
				}
			}
			ti->free_piece_layers();
		}

		atp.comment = ti->comment();
		atp.created_by = ti->creator();
		atp.creation_date = ti->creation_date();
		atp.info_hashes = ti->info_hashes();
		atp.ti = std::move(ti);
	}
}